

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::anon_unknown_0::FlushOnlyCase::init(FlushOnlyCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *this_01;
  EVP_PKEY_CTX *ctx_00;
  MessageBuilder local_190;
  FlushOnlyCase *local_10;
  FlushOnlyCase *this_local;
  
  local_10 = this;
  this_00 = tcu::TestContext::getLog
                      ((this->super_FlushFinishCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<(&local_190,(char (*) [25])"Single call to glFlush()");
  ctx_00 = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  iVar1 = FlushFinishCase::init(&this->super_FlushFinishCase,ctx_00);
  return iVar1;
}

Assistant:

void init (void)
	{
		m_testCtx.getLog() << TestLog::Message << "Single call to glFlush()" << TestLog::EndMessage;
		FlushFinishCase::init();
	}